

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O0

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CTextureUpdateCommand>
          (CCommandBuffer *this,CTextureUpdateCommand *Command)

{
  long lVar1;
  uchar *__dest;
  void *in_RSI;
  CBuffer *in_RDI;
  CTextureUpdateCommand *pCmd;
  bool local_1;
  
  __dest = (uchar *)CBuffer::Alloc(in_RDI,0x30,8);
  if (__dest == (uchar *)0x0) {
    local_1 = false;
  }
  else {
    memcpy(__dest,in_RSI,0x30);
    __dest[8] = '\0';
    __dest[9] = '\0';
    __dest[10] = '\0';
    __dest[0xb] = '\0';
    __dest[0xc] = '\0';
    __dest[0xd] = '\0';
    __dest[0xe] = '\0';
    __dest[0xf] = '\0';
    lVar1._0_4_ = in_RDI[2].m_Size;
    lVar1._4_4_ = in_RDI[2].m_Used;
    if (lVar1 != 0) {
      *(uchar **)(*(long *)&in_RDI[2].m_Size + 8) = __dest;
    }
    if (in_RDI[2].m_pData == (uchar *)0x0) {
      in_RDI[2].m_pData = __dest;
    }
    *(uchar **)&in_RDI[2].m_Size = __dest;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool AddCommand(const T &Command)
	{
		// make sure that we don't do something stupid like ->AddCommand(&Cmd);
		(void)static_cast<const CCommand *>(&Command);

		// allocate and copy the command into the buffer
		T *pCmd = (T *)m_CmdBuffer.Alloc(sizeof(*pCmd), 8); // TODO: use alignof(T)
		if(!pCmd)
			return false;
		*pCmd = Command;
		pCmd->m_pNext = 0;

		if(m_pCmdBufferTail)
			m_pCmdBufferTail->m_pNext = pCmd;
		if(!m_pCmdBufferHead)
			m_pCmdBufferHead = pCmd;
		m_pCmdBufferTail = pCmd;

		return true;
	}